

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_pairing.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
Base_pairing<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>
::Base_pairing(Base_pairing<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>
               *this)

{
  *(undefined8 *)&(this->super_type).map_._M_h._M_rehash_policy = 0;
  (this->super_type).map_._M_h._M_buckets = &(this->super_type).map_._M_h._M_single_bucket;
  (this->super_type).map_._M_h._M_bucket_count = 1;
  (this->super_type).map_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->super_type).map_._M_h._M_element_count = 0;
  (this->super_type).map_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->super_type).map_._M_h._M_rehash_policy._M_next_resize = 0;
  (this->super_type).map_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->barcode_).
  super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->barcode_).
  super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->barcode_).
  super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->deathToBar_)._M_h._M_buckets = &(this->deathToBar_)._M_h._M_single_bucket;
  (this->deathToBar_)._M_h._M_bucket_count = 1;
  (this->deathToBar_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->deathToBar_)._M_h._M_element_count = 0;
  (this->deathToBar_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->deathToBar_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->deathToBar_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->idToPosition_)._M_h._M_buckets = &(this->idToPosition_)._M_h._M_single_bucket;
  (this->idToPosition_)._M_h._M_bucket_count = 1;
  (this->idToPosition_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->idToPosition_)._M_h._M_element_count = 0;
  (this->idToPosition_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->idToPosition_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->idToPosition_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->isReduced_ = false;
  return;
}

Assistant:

inline Base_pairing<Master_matrix>::Base_pairing() : PIDM(), isReduced_(false) 
{}